

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

FILE * open_file_with_retries(char *pFilename,char *pMode)

{
  FILE *pFVar1;
  int iVar2;
  bool bVar3;
  
  iVar2 = 8;
  while ((bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, pFVar1 = (FILE *)0x0, bVar3 &&
         (pFVar1 = fopen64(pFilename,"rb"), pFVar1 == (FILE *)0x0))) {
    usleep(250000);
  }
  return (FILE *)pFVar1;
}

Assistant:

static FILE* open_file_with_retries(const char *pFilename, const char* pMode)
{
   const uint cNumRetries = 8;
   for (uint i = 0; i < cNumRetries; i++)
   {
      FILE* pFile = fopen(pFilename, pMode);
      if (pFile)
         return pFile;
      Sleep(250);
   }
   return NULL;
}